

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3IsReadOnly(Parse *pParse,Table *pTab,int viewOk)

{
  sqlite3 *psVar1;
  VTable *pVVar2;
  uint uVar3;
  char *pcVar4;
  char *zFormat;
  
  if (pTab->nModuleArg == 0) {
    if ((pTab->tabFlags & 0x401) != 0) {
      psVar1 = pParse->db;
      uVar3 = (uint)psVar1->flags;
      if ((pTab->tabFlags & 1) == 0) {
        if (((uVar3 >> 0x1c & 1) != 0) &&
           ((psVar1->pVtabCtx == (VtabCtx *)0x0 && (psVar1->nVdbeExec == 0)))) {
LAB_0017c458:
          pcVar4 = pTab->zName;
          zFormat = "table %s may not be modified";
          goto LAB_0017c4be;
        }
      }
      else if (((uVar3 & 0x10000001) != 1) && (pParse->nested == '\0')) goto LAB_0017c458;
    }
  }
  else {
    pVVar2 = sqlite3GetVTable(pParse->db,pTab);
    if (pVVar2->pMod->pModule->xUpdate ==
        (_func_int_sqlite3_vtab_ptr_int_sqlite3_value_ptr_ptr_sqlite3_int64_ptr *)0x0)
    goto LAB_0017c458;
  }
  if (viewOk != 0) {
    return 0;
  }
  if (pTab->pSelect == (Select *)0x0) {
    return 0;
  }
  pcVar4 = pTab->zName;
  zFormat = "cannot modify %s because it is a view";
LAB_0017c4be:
  sqlite3ErrorMsg(pParse,zFormat,pcVar4);
  return 1;
}

Assistant:

SQLITE_PRIVATE int sqlite3IsReadOnly(Parse *pParse, Table *pTab, int viewOk){
  if( tabIsReadOnly(pParse, pTab) ){
    sqlite3ErrorMsg(pParse, "table %s may not be modified", pTab->zName);
    return 1;
  }
#ifndef SQLITE_OMIT_VIEW
  if( !viewOk && pTab->pSelect ){
    sqlite3ErrorMsg(pParse,"cannot modify %s because it is a view",pTab->zName);
    return 1;
  }
#endif
  return 0;
}